

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c219.c
# Opt level: O2

UINT8 c219_r(void *chip,UINT16 offset)

{
  ushort uVar1;
  ushort uVar2;
  
  uVar2 = offset & 0x1ff;
  uVar1 = offset & 0x1f7;
  if ((offset & 1) == 0) {
    uVar1 = uVar2;
  }
  if (uVar2 < 0x1f8) {
    uVar1 = uVar2;
  }
  if ((uVar1 & 0x10f) == 5) {
    return *(byte *)((long)chip + (ulong)uVar1 + 0x20) & 0x3f |
           (*(char *)((long)chip + (ulong)(uVar1 >> 4) * 0x1c + 0x43c) != '\0') << 6;
  }
  return *(UINT8 *)((long)chip + (ulong)uVar1 + 0x20);
}

Assistant:

static UINT8 c219_r(void *chip, UINT16 offset)
{
	c219_state *info = (c219_state *)chip;
	offset &= 0x1ff;
	if (offset >= 0x1f8 && (offset & 0x001))
		offset &= ~0x008;

	// assume same as c140
	// TODO: what happens here on reading unmapped voice regs?
	if ((offset & 0xf) == 0x5 && offset < 0x100)
		return c219_keyon_status_read(info, offset);

	return info->REG[offset];
}